

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O3

Bounds string2bounds(string *boundString)

{
  char *__nptr;
  int iVar1;
  int iVar2;
  int iVar3;
  Bounds BVar5;
  char *t_1;
  char *t;
  allocator local_49;
  char *local_48 [2];
  char local_38 [16];
  char *local_28;
  long lVar4;
  
  __nptr = (boundString->_M_dataplus)._M_p;
  if (*__nptr == ':') {
    std::__cxx11::string::substr((ulong)local_48,(ulong)boundString);
    std::__cxx11::string::operator=((string *)boundString,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    iVar2 = 0;
  }
  else {
    lVar4 = strtol(__nptr,&local_28,10);
    iVar2 = (int)lVar4;
    std::__cxx11::string::string((string *)local_48,local_28,&local_49);
    std::__cxx11::string::operator=((string *)boundString,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    iVar3 = iVar2;
    if (boundString->_M_string_length == 0) goto LAB_001143a2;
    std::__cxx11::string::substr((ulong)local_48,(ulong)boundString);
    std::__cxx11::string::operator=((string *)boundString,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  iVar3 = 0x7fffffff;
LAB_001143a2:
  if (boundString->_M_string_length != 0) {
    lVar4 = strtol((boundString->_M_dataplus)._M_p,local_48,10);
    iVar3 = (int)lVar4;
  }
  iVar1 = iVar2;
  if (iVar2 < iVar3) {
    iVar1 = iVar3;
  }
  if (iVar3 < iVar2) {
    iVar2 = iVar3;
  }
  BVar5.upper = iVar1;
  BVar5.lower = iVar2;
  return BVar5;
}

Assistant:

Bounds string2bounds(std::string boundString)
{
	Bounds bounds = { 0, std::numeric_limits<int>::max() };

	if (boundString[0] != ':')
	{
		const char *s = boundString.c_str();
		char *t;
		bounds.lower = strtol(s, &t, 10);
		boundString = std::string(t);
		if (boundString.length() == 0)
		{
			bounds.upper = bounds.lower;
		}
		else
		{
			boundString = boundString.substr(1);
		}
	}
	else
	{
		boundString = boundString.substr(1);
	}

	if (boundString.length() > 0)
	{
		const char *s = boundString.c_str();
		char *t;
		bounds.upper = strtol(s, &t, 10);
	}

	if (bounds.upper < bounds.lower)
	{
		std::swap(bounds.upper, bounds.lower);
	}

	return bounds;
}